

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

void helper_stctl(CPUS390XState_conflict *env,uint32_t r1,uint64_t a2,uint32_t r3)

{
  uintptr_t unaff_retaddr;
  uint local_3c;
  uint64_t uStack_38;
  uint32_t i;
  uint64_t dest;
  uintptr_t ra;
  uint32_t r3_local;
  uint64_t a2_local;
  uint32_t r1_local;
  CPUS390XState_conflict *env_local;
  
  local_3c = r1;
  uStack_38 = a2;
  if ((a2 & 3) == 0) {
    while( true ) {
      cpu_stl_data_ra_s390x(env,uStack_38,(uint32_t)env->cregs[local_3c],unaff_retaddr);
      uStack_38 = uStack_38 + 4;
      if (local_3c == r3) break;
      local_3c = local_3c + 1 & 0xf;
    }
    return;
  }
  tcg_s390_program_interrupt_s390x(env,6,unaff_retaddr);
}

Assistant:

void HELPER(stctl)(CPUS390XState *env, uint32_t r1, uint64_t a2, uint32_t r3)
{
    uintptr_t ra = GETPC();
    uint64_t dest = a2;
    uint32_t i;

    if (dest & 0x3) {
        tcg_s390_program_interrupt(env, PGM_SPECIFICATION, ra);
    }

    for (i = r1;; i = (i + 1) % 16) {
        cpu_stl_data_ra(env, dest, env->cregs[i], ra);
        dest += sizeof(uint32_t);

        if (i == r3) {
            break;
        }
    }
}